

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFieldTypesTests::TestDateTime_getFraction_NanoSecond::RunImpl
          (TestDateTime_getFraction_NanoSecond *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int local_30;
  int local_2c;
  TestDetails local_28;
  
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30 = 1;
  local_2c = local_30;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x28);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30 = 0xc;
  local_2c = local_30;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x29);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30 = 0x7b;
  local_2c = local_30;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x2a);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 0x4d2;
  local_30 = 0x4d2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x2b);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 0x3039;
  local_30 = 0x3039;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x2c);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 0x1e240;
  local_30 = 0x1e240;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x2d);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 0x12d687;
  local_30 = 0x12d687;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x2e);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 0xbc614e;
  local_30 = 0xbc614e;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x2f);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 0x75bcd15;
  local_30 = 0x75bcd15;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x30);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c = 0x75bcd15;
  local_30 = 0x75bcd15;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x31);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_2c,&local_30,&local_28);
  return;
}

Assistant:

TEST(DateTime_getFraction_NanoSecond)
{
  FIX::DateTime dateTime;
  dateTime.setHMS(1,0,0,123456789,9);

  CHECK_EQUAL(1,dateTime.getFraction(1));
  CHECK_EQUAL(12,dateTime.getFraction(2));
  CHECK_EQUAL(123,dateTime.getFraction(3));
  CHECK_EQUAL(1234,dateTime.getFraction(4));
  CHECK_EQUAL(12345,dateTime.getFraction(5));
  CHECK_EQUAL(123456,dateTime.getFraction(6));
  CHECK_EQUAL(1234567,dateTime.getFraction(7));
  CHECK_EQUAL(12345678,dateTime.getFraction(8));
  CHECK_EQUAL(123456789,dateTime.getFraction(9));
  CHECK_EQUAL(123456789,dateTime.getFraction(25));

}